

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesBodySharedMass::Build_M
          (ChVariablesBodySharedMass *this,ChSparseMatrix *storage,int insrow,int inscol,double c_a)

{
  ChSharedMassBody *pCVar1;
  double *pdVar2;
  long lVar3;
  int j;
  long lVar4;
  bool bVar5;
  ChMatrix33<double> scaledJ;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  (**storage->_vptr_SparseMatrix)
            (c_a * this->sharedmass->mass,storage,(ulong)(uint)insrow,(ulong)(uint)inscol,1);
  (**storage->_vptr_SparseMatrix)
            (c_a * this->sharedmass->mass,storage,(ulong)(insrow + 1),(ulong)(inscol + 1),1);
  (**storage->_vptr_SparseMatrix)
            (c_a * this->sharedmass->mass,storage,(ulong)(insrow + 2),(ulong)(inscol + 2),1);
  pCVar1 = this->sharedmass;
  pdVar2 = &local_78;
  local_78 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
  dStack_70 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
  local_68 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
  dStack_60 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[3];
  local_58 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
  dStack_50 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
  local_48 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
  dStack_40 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[7];
  local_38 = c_a * (pCVar1->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                (pdVar2[lVar4],storage,(ulong)(uint)(insrow + 3 + (int)lVar3),
                 (ulong)(uint)(inscol + 3 + (int)lVar4),1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    pdVar2 = pdVar2 + 3;
    bVar5 = lVar3 != 2;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  return;
}

Assistant:

void ChVariablesBodySharedMass::Build_M(ChSparseMatrix& storage, int insrow, int inscol, const double c_a) {
    storage.SetElement(insrow + 0, inscol + 0, c_a * sharedmass->mass);
    storage.SetElement(insrow + 1, inscol + 1, c_a * sharedmass->mass);
    storage.SetElement(insrow + 2, inscol + 2, c_a * sharedmass->mass);
    ChMatrix33<> scaledJ = sharedmass->inertia * c_a;
    PasteMatrix(storage, scaledJ, insrow + 3, inscol + 3);
}